

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockstorage.cpp
# Opt level: O1

bool __thiscall
node::BlockManager::ReadBlockFromDisk(BlockManager *this,CBlock *block,CBlockIndex *index)

{
  uint256 *puVar1;
  bool bVar2;
  bool bVar3;
  FlatFilePos FVar4;
  long in_FS_OFFSET;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  string_view source_file;
  string_view logging_function;
  FlatFilePos block_pos;
  string local_98 [2];
  undefined1 local_50 [8];
  bool bStack_48;
  uchar uStack_47;
  uchar uStack_46;
  uchar uStack_45;
  uchar uStack_44;
  uchar uStack_43;
  uchar uStack_42;
  uchar uStack_41;
  undefined1 local_40;
  undefined1 uStack_3f;
  undefined1 uStack_3e;
  undefined1 uStack_3d;
  undefined1 uStack_3c;
  undefined1 uStack_3b;
  undefined1 uStack_3a;
  undefined1 uStack_39;
  undefined1 uStack_38;
  undefined1 uStack_37;
  undefined1 uStack_36;
  undefined1 uStack_35;
  undefined1 uStack_34;
  undefined1 uStack_33;
  undefined1 uStack_32;
  undefined1 uStack_31;
  undefined8 local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_50 = (undefined1  [8])&cs_main;
  bStack_48 = false;
  std::unique_lock<std::recursive_mutex>::lock((unique_lock<std::recursive_mutex> *)local_50);
  bVar3 = false;
  FVar4.nFile = -(uint)((index->nStatus & 8) == 0) | index->nFile;
  FVar4.nPos = (int)(index->nStatus << 0x1c) >> 0x1f & index->nDataPos;
  std::unique_lock<std::recursive_mutex>::~unique_lock
            ((unique_lock<std::recursive_mutex> *)local_50);
  block_pos = FVar4;
  bVar2 = ReadBlockFromDisk(this,block,&block_pos);
  if (bVar2) {
    CBlockHeader::GetHash((uint256 *)local_50,&block->super_CBlockHeader);
    puVar1 = index->phashBlock;
    if (puVar1 == (uint256 *)0x0) {
      __assert_fail("phashBlock != nullptr",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/chain.h"
                    ,0xf5,"uint256 CBlockIndex::GetBlockHash() const");
    }
    auVar6[0] = -(local_50[0] == (puVar1->super_base_blob<256U>).m_data._M_elems[0]);
    auVar6[1] = -(local_50[1] == (puVar1->super_base_blob<256U>).m_data._M_elems[1]);
    auVar6[2] = -(local_50[2] == (puVar1->super_base_blob<256U>).m_data._M_elems[2]);
    auVar6[3] = -(local_50[3] == (puVar1->super_base_blob<256U>).m_data._M_elems[3]);
    auVar6[4] = -(local_50[4] == (puVar1->super_base_blob<256U>).m_data._M_elems[4]);
    auVar6[5] = -(local_50[5] == (puVar1->super_base_blob<256U>).m_data._M_elems[5]);
    auVar6[6] = -(local_50[6] == (puVar1->super_base_blob<256U>).m_data._M_elems[6]);
    auVar6[7] = -(local_50[7] == (puVar1->super_base_blob<256U>).m_data._M_elems[7]);
    auVar6[8] = -(bStack_48 == (bool)(puVar1->super_base_blob<256U>).m_data._M_elems[8]);
    auVar6[9] = -(uStack_47 == (puVar1->super_base_blob<256U>).m_data._M_elems[9]);
    auVar6[10] = -(uStack_46 == (puVar1->super_base_blob<256U>).m_data._M_elems[10]);
    auVar6[0xb] = -(uStack_45 == (puVar1->super_base_blob<256U>).m_data._M_elems[0xb]);
    auVar6[0xc] = -(uStack_44 == (puVar1->super_base_blob<256U>).m_data._M_elems[0xc]);
    auVar6[0xd] = -(uStack_43 == (puVar1->super_base_blob<256U>).m_data._M_elems[0xd]);
    auVar6[0xe] = -(uStack_42 == (puVar1->super_base_blob<256U>).m_data._M_elems[0xe]);
    auVar6[0xf] = -(uStack_41 == (puVar1->super_base_blob<256U>).m_data._M_elems[0xf]);
    auVar5[0] = -(local_40 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x10]);
    auVar5[1] = -(uStack_3f == (puVar1->super_base_blob<256U>).m_data._M_elems[0x11]);
    auVar5[2] = -(uStack_3e == (puVar1->super_base_blob<256U>).m_data._M_elems[0x12]);
    auVar5[3] = -(uStack_3d == (puVar1->super_base_blob<256U>).m_data._M_elems[0x13]);
    auVar5[4] = -(uStack_3c == (puVar1->super_base_blob<256U>).m_data._M_elems[0x14]);
    auVar5[5] = -(uStack_3b == (puVar1->super_base_blob<256U>).m_data._M_elems[0x15]);
    auVar5[6] = -(uStack_3a == (puVar1->super_base_blob<256U>).m_data._M_elems[0x16]);
    auVar5[7] = -(uStack_39 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x17]);
    auVar5[8] = -(uStack_38 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x18]);
    auVar5[9] = -(uStack_37 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x19]);
    auVar5[10] = -(uStack_36 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1a]);
    auVar5[0xb] = -(uStack_35 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1b]);
    auVar5[0xc] = -(uStack_34 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1c]);
    auVar5[0xd] = -(uStack_33 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1d]);
    auVar5[0xe] = -(uStack_32 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1e]);
    auVar5[0xf] = -(uStack_31 == (puVar1->super_base_blob<256U>).m_data._M_elems[0x1f]);
    auVar5 = auVar5 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar5 >> 7,0) & 1) | (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar5 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar5 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar5 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar5 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar5 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar5 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar5 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar5 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar5 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar5 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar5 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar5 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar5 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar5[0xf] >> 7) << 0xf) == 0xffff) {
      bVar3 = true;
    }
    else {
      CBlockIndex::ToString_abi_cxx11_((string *)local_50,index);
      FlatFilePos::ToString_abi_cxx11_(local_98,&block_pos);
      source_file._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/node/blockstorage.cpp"
      ;
      source_file._M_len = 0x65;
      logging_function._M_str = "ReadBlockFromDisk";
      logging_function._M_len = 0x11;
      LogPrintFormatInternal<char[18],std::__cxx11::string,std::__cxx11::string>
                (logging_function,source_file,0x42f,ALL,Error,(ConstevalFormatString<3U>)0xfa0c5e,
                 (char (*) [18])"ReadBlockFromDisk",(string *)local_50,local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98[0]._M_dataplus._M_p != &local_98[0].field_2) {
        operator_delete(local_98[0]._M_dataplus._M_p,local_98[0].field_2._M_allocated_capacity + 1);
      }
      if (local_50 != (undefined1  [8])&stack0xffffffffffffffc0) {
        operator_delete((void *)local_50,
                        CONCAT17(uStack_39,
                                 CONCAT16(uStack_3a,
                                          CONCAT15(uStack_3b,
                                                   CONCAT14(uStack_3c,
                                                            CONCAT13(uStack_3d,
                                                                     CONCAT12(uStack_3e,
                                                                              CONCAT11(uStack_3f,
                                                                                       local_40)))))
                                         )) + 1);
      }
      bVar3 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockManager::ReadBlockFromDisk(CBlock& block, const CBlockIndex& index) const
{
    const FlatFilePos block_pos{WITH_LOCK(cs_main, return index.GetBlockPos())};

    if (!ReadBlockFromDisk(block, block_pos)) {
        return false;
    }
    if (block.GetHash() != index.GetBlockHash()) {
        LogError("%s: GetHash() doesn't match index for %s at %s\n", __func__, index.ToString(), block_pos.ToString());
        return false;
    }
    return true;
}